

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::GetDirectBufferPointer
          (CodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  uint8_t *puVar2;
  
  puVar2 = this->buffer_;
  if (*(int *)&this->buffer_end_ == (int)puVar2) {
    bVar1 = Refresh(this);
    if (!bVar1) {
      return false;
    }
    puVar2 = this->buffer_;
  }
  *data = puVar2;
  *size = *(int *)&this->buffer_end_ - *(int *)&this->buffer_;
  return true;
}

Assistant:

bool CodedInputStream::GetDirectBufferPointer(const void** data, int* size) {
  if (BufferSize() == 0 && !Refresh()) return false;

  *data = buffer_;
  *size = BufferSize();
  return true;
}